

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O0

int SSL_CTX_set0_verify_cert_store(SSL_CTX *ctx,X509_STORE *store)

{
  int iVar1;
  pointer pCVar2;
  X509_STORE *store_local;
  SSL_CTX *ctx_local;
  
  bssl::check_ssl_ctx_x509_method(ctx);
  pCVar2 = std::unique_ptr<bssl::CERT,_bssl::internal::Deleter>::operator->(&ctx->cert);
  iVar1 = set_cert_store(&pCVar2->verify_store,store,0);
  return iVar1;
}

Assistant:

int SSL_CTX_set0_verify_cert_store(SSL_CTX *ctx, X509_STORE *store) {
  check_ssl_ctx_x509_method(ctx);
  return set_cert_store(&ctx->cert->verify_store, store, 0);
}